

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.h
# Opt level: O0

int lre_js_is_ident_next(int c)

{
  int iVar1;
  uint in_EDI;
  bool local_9;
  uint local_4;
  
  if (in_EDI < 0x80) {
    local_4 = lre_id_continue_table_ascii[(int)in_EDI >> 5] >> ((byte)in_EDI & 0x1f) & 1;
  }
  else {
    iVar1 = lre_is_id_continue(0);
    local_9 = true;
    if ((iVar1 == 0) && (local_9 = true, in_EDI != 0x200c)) {
      local_9 = in_EDI == 0x200d;
    }
    local_4 = (uint)local_9;
  }
  return local_4;
}

Assistant:

static inline int lre_js_is_ident_next(int c)
{
    if ((uint32_t)c < 128) {
        return (lre_id_continue_table_ascii[c >> 5] >> (c & 31)) & 1;
    } else {
        /* ZWNJ and ZWJ are accepted in identifiers */
#ifdef CONFIG_ALL_UNICODE
        return lre_is_id_continue(c) || c == 0x200C || c == 0x200D;
#else
        return !lre_is_space(c) || c == 0x200C || c == 0x200D;
#endif
    }
}